

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult __thiscall
testing::(anonymous_namespace)::IsSubstringImpl<std::__cxx11::wstring>
          (_anonymous_namespace_ *this,bool expected_to_be_substring,char *needle_expr,
          char *haystack_expr,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *needle,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *haystack)

{
  bool bVar1;
  AssertionResult *pAVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar4;
  char *local_70 [3];
  AssertionResult local_58;
  char *local_48;
  char *begin_string_quote;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *pbStack_38;
  bool is_wide_string;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *haystack_local;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *needle_local;
  char *haystack_expr_local;
  char *needle_expr_local;
  _anonymous_namespace_ *p_Stack_10;
  bool expected_to_be_substring_local;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  pbStack_38 = haystack;
  haystack_local = needle;
  needle_local = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 haystack_expr;
  haystack_expr_local = needle_expr;
  needle_expr_local._7_1_ = expected_to_be_substring;
  p_Stack_10 = this;
  bVar1 = IsSubstringPred<std::__cxx11::wstring>(needle,haystack);
  if (bVar1 == (bool)(needle_expr_local._7_1_ & 1)) {
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  else {
    begin_string_quote._7_1_ = 1;
    local_48 = "L\"";
    AssertionFailure();
    pAVar2 = AssertionResult::operator<<(&local_58,(char (*) [11])"Value of: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&haystack_expr_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x16af70);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0x16a898);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_48);
    pAVar2 = AssertionResult::operator<<(pAVar2,haystack_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [3])0x16b29e);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0x16a8a4);
    local_70[0] = "not ";
    if ((needle_expr_local._7_1_ & 1) != 0) {
      local_70[0] = "";
    }
    pAVar2 = AssertionResult::operator<<(pAVar2,local_70);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [16])"a substring of ");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&needle_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x16af70);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [11])0x16a865);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_48);
    pAVar2 = AssertionResult::operator<<(pAVar2,pbStack_38);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x16b28b);
    AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
    AssertionResult::~AssertionResult(&local_58);
    sVar3.ptr_ = extraout_RDX;
  }
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult IsSubstringImpl(
    bool expected_to_be_substring,
    const char* needle_expr, const char* haystack_expr,
    const StringType& needle, const StringType& haystack) {
  if (IsSubstringPred(needle, haystack) == expected_to_be_substring)
    return AssertionSuccess();

  const bool is_wide_string = sizeof(needle[0]) > 1;
  const char* const begin_string_quote = is_wide_string ? "L\"" : "\"";
  return AssertionFailure()
      << "Value of: " << needle_expr << "\n"
      << "  Actual: " << begin_string_quote << needle << "\"\n"
      << "Expected: " << (expected_to_be_substring ? "" : "not ")
      << "a substring of " << haystack_expr << "\n"
      << "Which is: " << begin_string_quote << haystack << "\"";
}